

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

uint32_t trico_get_number_of_attributes(void *a)

{
  int iVar1;
  uint32_t local_24;
  void *pvStack_20;
  uint32_t nr_attribs;
  trico_archive *arch;
  void *a_local;
  
  if ((((*(int *)((long)a + 0x24) == 0xf) || (*(int *)((long)a + 0x24) == 0x10)) ||
      (*(int *)((long)a + 0x24) == 0x11)) ||
     (((*(int *)((long)a + 0x24) == 0x12 || (*(int *)((long)a + 0x24) == 0x13)) ||
      (*(int *)((long)a + 0x24) == 0x14)))) {
    pvStack_20 = a;
    arch = (trico_archive *)a;
    iVar1 = read_inplace(&local_24,4,1,(trico_archive *)a);
    if (iVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = local_24;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

uint32_t trico_get_number_of_attributes(void* a)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (arch->next_stream_type == trico_attribute_float_stream || arch->next_stream_type == trico_attribute_double_stream ||
    arch->next_stream_type == trico_attribute_uint8_stream || arch->next_stream_type == trico_attribute_uint16_stream ||
    arch->next_stream_type == trico_attribute_uint32_stream || arch->next_stream_type == trico_attribute_uint64_stream)
    {
    uint32_t nr_attribs;
    if (!read_inplace(&nr_attribs, sizeof(uint32_t), 1, arch))
      return 0;
    return nr_attribs;
    }
  return 0;
  }